

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_bspline_row(REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_DBL *N)

{
  REF_STATUS RVar1;
  ulong uVar2;
  uint uVar3;
  REF_INT span;
  REF_DBL n [16];
  int local_bc;
  REF_DBL local_b8 [17];
  
  if (degree < 0x10) {
    ref_geom_bspline_span_index(degree,n_control_point,knots,t,&local_bc);
    RVar1 = ref_geom_bspline_basis(degree,knots,t,local_bc,local_b8);
    if (RVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10b4
             ,"ref_geom_bspline_row",1,"basis");
    }
    uVar3 = (uint)(RVar1 != 0);
    if (RVar1 == 0) {
      if (0 < n_control_point) {
        memset(N,0,(ulong)(uint)n_control_point << 3);
      }
      if (degree < 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        uVar2 = 0;
        do {
          N[(long)(local_bc - degree) + uVar2] = local_b8[uVar2];
          uVar2 = uVar2 + 1;
        } while (degree + 1 != uVar2);
      }
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10b0,
           "ref_geom_bspline_row","temp variables sized smaller than degree");
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_row(REF_INT degree, REF_INT n_control_point,
                                        REF_DBL *knots, REF_DBL t, REF_DBL *N) {
  REF_INT span;
  REF_DBL n[16];
  REF_INT i, point;
  REF_BOOL verbose = REF_FALSE;
  RAS(degree < 16, "temp variables sized smaller than degree");
  RSS(ref_geom_bspline_span_index(degree, n_control_point, knots, t, &span),
      "index");
  if (verbose) printf("deg %d ncp %d span %d :", degree, n_control_point, span);
  RSS(ref_geom_bspline_basis(degree, knots, t, span, n), "basis");
  for (i = 0; i < n_control_point; i++) {
    N[i] = 0.0;
  }
  for (i = 0; i < degree + 1; i++) {
    point = span - degree + i;
    N[point] = n[i];
  }

  if (verbose) {
    for (i = 0; i < n_control_point; i++) {
      printf(" %f", N[i]);
    }
    printf("\n");
  }

  return REF_SUCCESS;
}